

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decUtil.c
# Opt level: O2

uint Dec_GraphDeriveTruth(Dec_Graph_t *pGraph)

{
  Dec_Edge_t DVar1;
  uint uVar2;
  Dec_Node_t *pDVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  uint *puVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  char *__assertion;
  
  uVar8 = pGraph->nLeaves;
  if ((int)uVar8 < 0) {
    __assertion = "Dec_GraphLeaveNum(pGraph) >= 0";
    uVar8 = 0x6f;
  }
  else if (pGraph->nSize < (int)uVar8) {
    __assertion = "Dec_GraphLeaveNum(pGraph) <= pGraph->nSize";
    uVar8 = 0x70;
  }
  else {
    if (uVar8 < 6) {
      DVar1 = pGraph->eRoot;
      if (pGraph->fConst == 0) {
        if (((uint)DVar1 >> 1 & 0x3fffffff) < uVar8) {
          iVar4 = Dec_GraphVarInt(pGraph);
          uVar8 = -((uint)DVar1 & 1) ^ (&DAT_007bf6f0)[iVar4];
        }
        else {
          lVar6 = 2;
          puVar7 = &DAT_007bf6f0;
          for (lVar10 = 0; lVar5 = (long)(int)uVar8, lVar10 < lVar5; lVar10 = lVar10 + 1) {
            *(ulong *)(&pGraph->pNodes->eEdge0 + lVar6) = (ulong)*puVar7;
            uVar8 = pGraph->nLeaves;
            lVar6 = lVar6 + 6;
            puVar7 = puVar7 + 1;
          }
          lVar6 = lVar5 * 0x18 + 8;
          uVar9 = 0;
          for (; lVar5 < pGraph->nSize; lVar5 = lVar5 + 1) {
            pDVar3 = pGraph->pNodes;
            uVar8 = *(uint *)((long)pDVar3 + lVar6 + -8);
            uVar2 = *(uint *)((long)pDVar3 + lVar6 + -4);
            uVar9 = (ulong)((-(uVar2 & 1) ^ pDVar3[uVar2 >> 1 & 0x3fffffff].field_2.iFunc) &
                           (-(uVar8 & 1) ^ pDVar3[uVar8 >> 1 & 0x3fffffff].field_2.iFunc));
            *(ulong *)(&(pDVar3->eEdge0).field_0x0 + lVar6) = uVar9;
            lVar6 = lVar6 + 0x18;
          }
          uVar8 = (uint)uVar9 ^ -((uint)pGraph->eRoot & 1);
        }
      }
      else {
        uVar8 = ((uint)DVar1 & 1) - 1;
      }
      return uVar8;
    }
    __assertion = "Dec_GraphLeaveNum(pGraph) <= 5";
    uVar8 = 0x71;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/dec/decUtil.c"
                ,uVar8,"unsigned int Dec_GraphDeriveTruth(Dec_Graph_t *)");
}

Assistant:

unsigned Dec_GraphDeriveTruth( Dec_Graph_t * pGraph )
{
    unsigned uTruths[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
    unsigned uTruth = 0; // Suppress "might be used uninitialized"
    unsigned uTruth0, uTruth1;
    Dec_Node_t * pNode;
    int i;

    // sanity checks
    assert( Dec_GraphLeaveNum(pGraph) >= 0 );
    assert( Dec_GraphLeaveNum(pGraph) <= pGraph->nSize );
    assert( Dec_GraphLeaveNum(pGraph) <= 5 );

    // check for constant function
    if ( Dec_GraphIsConst(pGraph) )
        return Dec_GraphIsComplement(pGraph)? 0 : ~((unsigned)0);
    // check for a literal
    if ( Dec_GraphIsVar(pGraph) )
        return Dec_GraphIsComplement(pGraph)? ~uTruths[Dec_GraphVarInt(pGraph)] : uTruths[Dec_GraphVarInt(pGraph)];

    // assign the elementary variables
    Dec_GraphForEachLeaf( pGraph, pNode, i )
        pNode->pFunc = (void *)(ABC_PTRUINT_T)uTruths[i];

    // compute the function for each internal node
    Dec_GraphForEachNode( pGraph, pNode, i )
    {
        uTruth0 = (unsigned)(ABC_PTRUINT_T)Dec_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc;
        uTruth1 = (unsigned)(ABC_PTRUINT_T)Dec_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc;
        uTruth0 = pNode->eEdge0.fCompl? ~uTruth0 : uTruth0;
        uTruth1 = pNode->eEdge1.fCompl? ~uTruth1 : uTruth1;
        uTruth = uTruth0 & uTruth1;
        pNode->pFunc = (void *)(ABC_PTRUINT_T)uTruth;
    }

    // complement the result if necessary
    return Dec_GraphIsComplement(pGraph)? ~uTruth : uTruth;
}